

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::BIP32PubkeyProvider::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,StringType type,bool normalized)

{
  char __c;
  undefined3 in_register_00000009;
  long in_FS_OFFSET;
  bool apostrophe;
  string local_60;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((CONCAT31(in_register_00000009,normalized) != 0) ||
     (apostrophe = true, *(char *)((long)this + 0x9c) == '\0')) {
    apostrophe = type == COMPAT;
  }
  EncodeExtPubKey_abi_cxx11_(&local_40,(CExtPubKey *)((long)this + 0xc));
  FormatHDKeypath_abi_cxx11_
            (&local_60,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)this + 0x80),
             apostrophe);
  std::operator+(__return_storage_ptr__,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(int *)((long)this + 0x98) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"/*");
    if (*(int *)((long)this + 0x98) == 2) {
      __c = 'h';
      if (apostrophe != false) {
        __c = '\'';
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,__c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString(StringType type, bool normalized) const
    {
        // If StringType==COMPAT, always use the apostrophe to stay compatible with previous versions
        const bool use_apostrophe = (!normalized && m_apostrophe) || type == StringType::COMPAT;
        std::string ret = EncodeExtPubKey(m_root_extkey) + FormatHDKeypath(m_path, /*apostrophe=*/use_apostrophe);
        if (IsRange()) {
            ret += "/*";
            if (m_derive == DeriveType::HARDENED) ret += use_apostrophe ? '\'' : 'h';
        }
        return ret;
    }